

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

size_t __thiscall kws::Parser::FindFunction(Parser *this,size_t pos,char *buffer)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  string buf;
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&buf,(string *)&this->m_BufferNoComment);
  if (buffer != (char *)0x0) {
    std::__cxx11::string::assign((char *)&buf);
  }
  sVar4 = 0xffffffffffffffff;
  if ((pos != 0xffffffffffffffff) && (pos <= buf._M_string_length - 1)) {
LAB_0011d34e:
    do {
      sVar4 = std::__cxx11::string::find((char)&buf,0x7d);
      if ((sVar4 == 0xffffffffffffffff) ||
         (sVar4 = FindOpeningChar(this,'}','{',sVar4,true), sVar4 == 0xffffffffffffffff)) {
        sVar4 = 0xffffffffffffffff;
        break;
      }
      sVar6 = sVar4;
      bVar2 = true;
      bVar3 = true;
      while (sVar6 = sVar6 - 1, sVar6 != 0xffffffffffffffff) {
        cVar1 = buf._M_dataplus._M_p[sVar6];
        if ((cVar1 != '\r') && (cVar1 != ' ')) {
          if (cVar1 == ')') {
            if (bVar2) goto LAB_0011d474;
            std::__cxx11::string::substr((ulong)local_70,(ulong)&buf);
            lVar5 = std::__cxx11::string::find((char *)local_70,0x1557a1);
            if (lVar5 == -1) {
              std::__cxx11::string::substr((ulong)local_50,(ulong)&buf);
              lVar5 = std::__cxx11::string::find((char *)local_50,0x159759);
              std::__cxx11::string::~string(local_50);
              std::__cxx11::string::~string(local_70);
              if (lVar5 != -1) goto LAB_0011d474;
            }
            else {
              std::__cxx11::string::~string(local_70);
            }
            goto LAB_0011d34e;
          }
          bVar2 = bVar3;
          if (cVar1 != '\n') {
            bVar2 = false;
            bVar3 = bVar2;
          }
        }
      }
      if (bVar2) break;
    } while( true );
  }
LAB_0011d474:
  std::__cxx11::string::~string((string *)&buf);
  return sVar4;
}

Assistant:

size_t Parser::FindFunction(size_t pos,const char* buffer) const
{
  std::string buf = m_BufferNoComment;

  if(buffer)
    {
    buf = buffer;
    }

  if((pos == std::string::npos) || pos > buf.size()-1)
    {
    return std::string::npos;
    }

  // a function is defined as:
  // function() [const] {}; and if() {} is considered as a function
  // here.

  // We go backwards
  size_t end = buf.find('}',pos);
  while(end != std::string::npos)
    {
    size_t beg = this->FindOpeningChar('}','{',end,true);
    if(beg == std::string::npos)
        {
        break;
        }

    // check that before the beg we have
    bool nospecialchar=true;
    size_t i = beg-1;
    while(i != std::string::npos)
      {
      if(buf[i] == ')')
        {
        break;
        }
      else if(
        buf[i] != ' ' && buf[i] != '\r'
        && buf[i] != '\n'
        )
        {
        nospecialchar = false;
        }
      --i;
      }

    if(nospecialchar)
      {
      return beg;
      }
    if(i != std::string::npos)// check if we have a const
      {
      if(buf.substr(i,beg-i).find("]") == std::string::npos &&
         buf.substr(i,beg-i).find("const") != std::string::npos
        )
        {
        return beg;
        }
      }
    end = buf.find('}',end+1);
    }

  return std::string::npos;
}